

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceObjectArchive::Serialize(DeviceObjectArchive *this,IFileStream *pStream)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char (*in_RCX) [10];
  RefCntAutoPtr<Diligent::IDataBlob> pDataBlob;
  string msg;
  RefCntAutoPtr<Diligent::IDataBlob> local_40;
  string local_38;
  
  if (pStream == (IFileStream *)0x0) {
    FormatString<char[29]>(&local_38,(char (*) [29])"File stream must not be null");
    in_RCX = (char (*) [10])0x29d;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x29d);
    std::__cxx11::string::~string((string *)&local_38);
  }
  local_38._M_string_length = (size_type)&local_40;
  local_40.m_pObject = (IDataBlob *)0x0;
  local_38._M_dataplus._M_p = (Char *)0x0;
  Serialize(this,(IDataBlob **)&local_38);
  RefCntAutoPtr<Diligent::IDataBlob>::DoublePtrHelper<Diligent::IDataBlob>::~DoublePtrHelper
            ((DoublePtrHelper<Diligent::IDataBlob> *)&local_38);
  if (local_40.m_pObject == (IDataBlob *)0x0) {
    FormatString<char[26],char[10]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pDataBlob",in_RCX)
    ;
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x2a0);
    std::__cxx11::string::~string((string *)&local_38);
  }
  iVar1 = (*((local_40.m_pObject)->super_IObject)._vptr_IObject[7])(local_40.m_pObject,0);
  iVar2 = (*((local_40.m_pObject)->super_IObject)._vptr_IObject[5])();
  (*(pStream->super_IObject)._vptr_IObject[6])
            (pStream,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  RefCntAutoPtr<Diligent::IDataBlob>::Release(&local_40);
  return;
}

Assistant:

void DeviceObjectArchive::Serialize(IFileStream* pStream) const
{
    DEV_CHECK_ERR(pStream != nullptr, "File stream must not be null");
    RefCntAutoPtr<IDataBlob> pDataBlob;
    Serialize(&pDataBlob);
    VERIFY_EXPR(pDataBlob);
    pStream->Write(pDataBlob->GetConstDataPtr(), pDataBlob->GetSize());
}